

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.hpp
# Opt level: O3

bool pstore::command_line::details::
     parse_command_line_options<char*const*,std::ostream,std::ostream>
               (char **first_arg,char **last_arg,string *overview,
               basic_ostream<char,_std::char_traits<char>_> *outs,
               basic_ostream<char,_std::char_traits<char>_> *errs)

{
  pointer pcVar1;
  bool bVar2;
  string program_name;
  help<std::basic_ostream<char,_std::char_traits<char>_>_> help;
  name local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  undefined1 local_100 [208];
  
  std::__cxx11::string::string((string *)local_100,*first_arg,(allocator *)&local_1a0);
  pstore::path::posix::base_name(&local_160,(string *)local_100);
  if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_180,local_160._M_dataplus._M_p,
             local_160._M_dataplus._M_p + local_160._M_string_length);
  pcVar1 = (overview->_M_dataplus)._M_p;
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_120,pcVar1,pcVar1 + overview->_M_string_length);
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"help","");
  name::name(&local_1a0,&local_140);
  help<std::basic_ostream<char,_std::char_traits<char>_>_>::help<pstore::command_line::name>
            ((help<std::basic_ostream<char,_std::char_traits<char>_>_> *)local_100,&local_180,
             &local_120,outs,&local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_1a0.name_._M_dataplus._M_p._1_7_,local_1a0.name_._M_dataplus._M_p._0_1_) !=
      &local_1a0.name_.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_1a0.name_._M_dataplus._M_p._1_7_,
                             local_1a0.name_._M_dataplus._M_p._0_1_),
                    local_1a0.name_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  parse_option_arguments<char*const*,std::ostream>
            ((details *)&local_1a0,first_arg + 1,last_arg,&local_160,errs);
  if (local_1a0.name_._M_dataplus._M_p._0_1_ != (allocator)0x0) {
    bVar2 = parse_positional_arguments<char*const*>
                      ((char **)local_1a0.name_._M_string_length,last_arg);
    if (bVar2) {
      bVar2 = check_for_missing<std::ostream>(&local_160,errs);
      goto LAB_0010f92f;
    }
  }
  bVar2 = false;
LAB_0010f92f:
  help<std::basic_ostream<char,_std::char_traits<char>_>_>::~help
            ((help<std::basic_ostream<char,_std::char_traits<char>_>_> *)local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool parse_command_line_options (InputIterator first_arg, InputIterator last_arg,
                                             std::string const & overview, OutputStream & outs,
                                             ErrorStream & errs) {
                std::string const program_name = pstore::path::base_name (*(first_arg++));
                help<OutputStream> const help (program_name, overview, outs, name ("help"));

                bool ok = true;
                std::tie (first_arg, ok) =
                    parse_option_arguments (first_arg, last_arg, program_name, errs);
                if (!ok) {
                    return false;
                }
                if (!parse_positional_arguments (first_arg, last_arg)) {
                    return false;
                }
                return check_for_missing (program_name, errs);
            }